

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

int __thiscall PP_Expression::conditional_expression(PP_Expression *this)

{
  bool bVar1;
  int iVar2;
  Parser *in_RDI;
  int alt2;
  int alt1;
  int value;
  int local_30;
  Token in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = logical_OR_expression((PP_Expression *)in_RDI);
  bVar1 = Parser::test(in_RDI,in_stack_ffffffffffffffd4);
  if (bVar1) {
    iVar2 = conditional_expression((PP_Expression *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
    bVar1 = Parser::test(in_RDI,in_stack_ffffffffffffffd4);
    if (bVar1) {
      local_30 = conditional_expression((PP_Expression *)CONCAT44(local_4,iVar2));
    }
    else {
      local_30 = 0;
    }
    if (local_4 != 0) {
      local_30 = iVar2;
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

int PP_Expression::conditional_expression()
{
    int value = logical_OR_expression();
    if (test(PP_QUESTION)) {
        int alt1 = conditional_expression();
        int alt2 = test(PP_COLON) ? conditional_expression() : 0;
        return value ? alt1 : alt2;
    }
    return value;
}